

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuspendingcall.cpp
# Opt level: O1

void __thiscall
QDBusPendingCallWatcher::QDBusPendingCallWatcher
          (QDBusPendingCallWatcher *this,QDBusPendingCall *call,QObject *parent)

{
  __base_type _Var1;
  QDBusPendingCallPrivate *pQVar2;
  MessageType MVar3;
  QObject *this_00;
  QMutex *pQVar4;
  long in_FS_OFFSET;
  bool bVar5;
  code *local_48;
  undefined8 local_40;
  QMetaMethodReturnArgument local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject(&this->super_QObject,parent);
  pQVar2 = (call->d).d.ptr;
  (this->super_QDBusPendingCall).d.d.ptr = pQVar2;
  if (pQVar2 != (QDBusPendingCallPrivate *)0x0) {
    LOCK();
    (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  *(undefined ***)this = &PTR_metaObject_001c1ed0;
  pQVar2 = (this->super_QDBusPendingCall).d.d.ptr;
  if (pQVar2 == (QDBusPendingCallPrivate *)0x0) goto LAB_00188b89;
  pQVar4 = &pQVar2->mutex;
  if ((pQVar2->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar5 = (pQVar4->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar5) {
      (pQVar4->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar5) goto LAB_00188ae0;
  }
  else {
LAB_00188ae0:
    QBasicMutex::lockInternal();
  }
  if (((this->super_QDBusPendingCall).d.d.ptr)->watcherHelper ==
      (QDBusPendingCallWatcherHelper *)0x0) {
    this_00 = (QObject *)operator_new(0x10);
    QObject::QObject(this_00,(QObject *)0x0);
    *(undefined ***)this_00 = &PTR_metaObject_001c2008;
    pQVar2 = (this->super_QDBusPendingCall).d.d.ptr;
    pQVar2->watcherHelper = (QDBusPendingCallWatcherHelper *)this_00;
    MVar3 = QDBusMessage::type(&pQVar2->replyMessage);
    if (MVar3 != InvalidMessage) {
      local_48 = QDBusPendingCallWatcherHelper::finished;
      local_40 = 0;
      local_38.metaType = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
      local_38.name = (char *)0x0;
      local_38.data = (void *)0x0;
      QMetaObject::invokeMethodCallableHelper<void(QDBusPendingCallWatcherHelper::*)()>
                (((this->super_QDBusPendingCall).d.d.ptr)->watcherHelper,
                 (offset_in_QDBusPendingCallWatcherHelper_to_subr *)&local_48,QueuedConnection,
                 &local_38);
    }
  }
  QDBusPendingCallWatcherHelper::add(((this->super_QDBusPendingCall).d.d.ptr)->watcherHelper,this);
  LOCK();
  _Var1._M_p = (pQVar4->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (pQVar4->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (_Var1._M_p != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(pQVar4);
  }
LAB_00188b89:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QDBusPendingCallWatcher::QDBusPendingCallWatcher(const QDBusPendingCall &call, QObject *parent)
    : QObject(parent), QDBusPendingCall(call)
{
    if (d) {                    // QDBusPendingCall::d
        const auto locker = qt_scoped_lock(d->mutex);
        if (!d->watcherHelper) {
            d->watcherHelper = new QDBusPendingCallWatcherHelper;
            if (d->replyMessage.type() != QDBusMessage::InvalidMessage) {
                // cause a signal emission anyways
                QMetaObject::invokeMethod(d->watcherHelper,
                                          &QDBusPendingCallWatcherHelper::finished,
                                          Qt::QueuedConnection);
            }
        }
        d->watcherHelper->add(this);
    }
}